

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_sort_id_bfr(Btor2Parser *bfr,Btor2Sort *res)

{
  int32_t iVar1;
  Btor2Line *pBVar2;
  void *in_RSI;
  Btor2Parser *in_RDI;
  Btor2Line *s;
  int64_t sort_id;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = parse_id_bfr((Btor2Parser *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int64_t *)in_RDI);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if ((local_20 < in_RDI->ntable) &&
       (pBVar2 = id2line_bfr(in_RDI,local_20), pBVar2 != (Btor2Line *)0x0)) {
      pBVar2 = id2line_bfr(in_RDI,local_20);
      if (pBVar2->tag != BTOR2_TAG_sort) {
        iVar1 = perr_bfr(in_RDI,"id after tag is not a sort id");
        return iVar1;
      }
      memcpy(in_RSI,&pBVar2->sort,0x28);
      return 1;
    }
    iVar1 = perr_bfr(in_RDI,"undefined sort id");
  }
  return iVar1;
}

Assistant:

static int32_t
parse_sort_id_bfr (Btor2Parser *bfr, Btor2Sort *res)
{
  int64_t sort_id;
  Btor2Line *s;
  if (!parse_id_bfr (bfr, &sort_id)) return 0;

  if (sort_id >= bfr->ntable || id2line_bfr (bfr, sort_id) == 0)
    return perr_bfr (bfr, "undefined sort id");

  s = id2line_bfr (bfr, sort_id);
  if (s->tag != BTOR2_TAG_sort)
    return perr_bfr (bfr, "id after tag is not a sort id");
  *res = s->sort;
  return 1;
}